

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O1

bool __thiscall btLemkeAlgorithm::greaterZero(btLemkeAlgorithm *this,btVectorXf *vector)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar3 = (ulong)(vector->m_storage).m_size;
  bVar5 = (long)uVar3 < 1;
  if ((0 < (long)uVar3) && (pfVar1 = (vector->m_storage).m_data, 0.0 < *pfVar1 || *pfVar1 == 0.0)) {
    uVar2 = 1;
    do {
      uVar4 = uVar2;
      if (uVar3 == uVar4) break;
      uVar2 = uVar4 + 1;
    } while (0.0 < pfVar1[uVar4] || pfVar1[uVar4] == 0.0);
    bVar5 = uVar3 <= uVar4;
  }
  return bVar5;
}

Assistant:

bool btLemkeAlgorithm::greaterZero(const btVectorXu & vector)
{
    bool isGreater = true;
    for (int i = 0; i < vector.size(); i++) {
      if (vector[i] < 0) {
        isGreater = false;
        break;
      }
    }

    return isGreater;
  }